

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writer.cc
# Opt level: O0

bool __thiscall
xsettingsd::DataWriter::WriteBytes(DataWriter *this,char *data,size_t bytes_to_write)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  unsigned_long *puVar4;
  unsigned_long local_30;
  size_t local_28;
  size_t bytes_to_write_local;
  char *data_local;
  DataWriter *this_local;
  
  bVar3 = bytes_to_write <= this->buf_len_ - this->bytes_written_;
  if (bVar3) {
    pcVar1 = this->buffer_;
    sVar2 = this->bytes_written_;
    local_30 = this->buf_len_ - this->bytes_written_;
    local_28 = bytes_to_write;
    bytes_to_write_local = (size_t)data;
    data_local = (char *)this;
    puVar4 = std::min<unsigned_long>(&local_28,&local_30);
    memcpy(pcVar1 + sVar2,data,*puVar4);
    this->bytes_written_ = local_28 + this->bytes_written_;
  }
  return bVar3;
}

Assistant:

bool DataWriter::WriteBytes(const char* data, size_t bytes_to_write) {
  if (bytes_to_write > buf_len_ - bytes_written_)
    return false;

  memcpy(buffer_ + bytes_written_,
         data,
         min(bytes_to_write, buf_len_ - bytes_written_));
  bytes_written_ += bytes_to_write;
  return true;
}